

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::GetGeomPrimvar
               (Stage *stage,GPrim *gprim,string *varname,GeomPrimvar *out_primvar,string *err)

{
  Attribute *pAVar1;
  bool bVar2;
  char cVar3;
  uint32_t uVar4;
  int iVar5;
  const_iterator cVar6;
  ostream *poVar7;
  Attribute *pAVar8;
  long lVar9;
  char *pcVar10;
  _Rb_tree_header *p_Var11;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss;
  string index_name;
  vector<int,_std::allocator<int>_> indices_1;
  string primvar_name;
  vector<int,_std::allocator<int>_> indices;
  Attribute terminal_attr;
  ostringstream ss_e_4;
  ostringstream ss_e;
  undefined1 local_848 [40];
  string local_820;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_800;
  key_type local_7f8;
  string local_7d8;
  Stage *local_7b8;
  GeomPrimvar *local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  vector<int,_std::allocator<int>_> local_788;
  undefined1 local_770 [112];
  ios_base iStack_700;
  undefined7 uStack_6ff;
  undefined1 uStack_6f8;
  undefined8 uStack_6f7;
  undefined1 local_6e8 [24];
  AttrMetas AStack_6d0;
  string local_4c8 [3];
  ios_base local_458 [264];
  undefined1 local_350 [112];
  storage_union local_2e0;
  undefined **local_2d0;
  bool local_2c8;
  pointer local_2c0;
  undefined1 uStack_2b8;
  undefined7 uStack_2b7;
  undefined1 uStack_2b0;
  undefined8 uStack_2af;
  pointer pPStack_2a0;
  undefined1 uStack_298;
  undefined7 local_297;
  undefined1 uStack_290;
  undefined8 uStack_28f;
  storage_t<tinyusdz::Interpolation> local_284;
  bool local_280;
  storage_t<unsigned_int> local_27c;
  optional<bool> local_278;
  bool local_270;
  storage_t<tinyusdz::value::StringData> local_268;
  bool local_238;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_230;
  bool local_200;
  storage_t<double> local_1f8;
  bool local_1f0;
  storage_t<tinyusdz::Token> local_1e8;
  bool local_1c8;
  storage_t<tinyusdz::Token> local_1c0;
  bool local_1a0;
  storage_t<tinyusdz::Token> local_198;
  bool local_178;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_170;
  bool local_140;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  bool local_118;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  bool local_f0;
  storage_t<tinyusdz::Token> local_e8;
  undefined1 local_c0 [24];
  Attribute *local_a8;
  size_t local_a0;
  pointer pSStack_98;
  pointer local_90;
  pointer pSStack_88;
  vector<int,_std::allocator<int>_> local_80;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  vStack_68;
  bool local_50;
  bool local_48;
  storage_t<int> local_44;
  bool local_40;
  storage_t<unsigned_int> local_3c;
  bool local_38;
  storage_t<tinyusdz::Interpolation> local_34;
  
  if (out_primvar == (GeomPrimvar *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"GetGeomPrimvar",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0xa2d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar10 = "Output GeomPrimvar is nullptr.";
    lVar9 = 0x1e;
LAB_004fbb1f:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,pcVar10,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_770._0_8_);
      if ((undefined1 *)local_770._0_8_ != local_770 + 0x10) {
        operator_delete((void *)local_770._0_8_,CONCAT71(local_770._17_7_,local_770[0x10]) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
    ::std::ios_base::~ios_base((ios_base *)(local_350 + 0x70));
    return false;
  }
  if (gprim == (GPrim *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"GetGeomPrimvar",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0xa31);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar10 = "Input `gprim` arg is nullptr.";
    lVar9 = 0x1d;
    goto LAB_004fbb1f;
  }
  local_350._0_8_ = local_350 + 0x10;
  bVar2 = false;
  local_350._8_8_ = 0;
  local_350[0x10] = '\0';
  local_350[0x20] = false;
  local_350._40_8_ = local_350 + 0x38;
  local_350._48_8_ = 0;
  local_350[0x38] = '\0';
  local_350._72_4_ = Varying;
  local_350[0x4c] = false;
  local_350._80_8_ = local_350 + 0x60;
  local_350._88_8_ = 0;
  local_350[0x60] = '\0';
  local_2d0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_2e0.dynamic = (void *)0x0;
  local_2c8 = false;
  local_2c0 = (pointer)0x0;
  uStack_2b8 = 0;
  uStack_2b7 = 0;
  uStack_2b0 = 0;
  uStack_2af = 0;
  local_284 = (storage_t<tinyusdz::Interpolation>)0x0;
  local_280 = false;
  local_27c = (storage_t<unsigned_int>)0x0;
  local_278.has_value_ = false;
  local_278.contained = (storage_t<bool>)0x0;
  local_270 = false;
  local_1f8 = (storage_t<double>)0x0;
  local_1f0 = false;
  local_e8._16_8_ = 0;
  local_e8._24_8_ = 0;
  local_e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_e8._8_8_ = 0;
  pAVar8 = (Attribute *)(local_350 + 0x290);
  local_c0._0_4_ = _S_red;
  local_c0._8_8_ = (_Base_ptr)0x0;
  local_268.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_268._8_8_ = 0;
  local_268._16_8_ = 0;
  local_268._24_8_ = 0;
  local_268._32_8_ = 0;
  local_268._40_8_ = 0;
  local_238 = false;
  local_230.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  local_230._32_8_ = 0;
  local_230._40_8_ = 0;
  local_200 = false;
  local_1e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_1e8._8_8_ = 0;
  local_1e8._16_8_ = 0;
  local_1e8._24_8_ = 0;
  local_1c8 = false;
  local_1c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_1c0._8_8_ = 0;
  local_1c0._16_8_ = 0;
  local_1c0._24_8_ = 0;
  local_1a0 = false;
  local_178 = false;
  local_198._16_8_ = 0;
  local_198._24_8_ = 0;
  local_198.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_198._8_8_ = 0;
  local_140 = false;
  local_170._32_8_ = 0;
  local_170._40_8_ = 0;
  local_170._16_8_ = 0;
  local_170._24_8_ = 0;
  local_170.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_170._8_8_ = 0;
  local_118 = false;
  local_138._16_8_ = 0;
  local_138._24_8_ = 0;
  local_138.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_138._8_8_ = 0;
  local_f0 = false;
  local_110._16_8_ = 0;
  local_110._24_8_ = 0;
  local_110.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_110._8_8_ = 0;
  uStack_290 = 0;
  uStack_28f = 0;
  pPStack_2a0 = (pointer)0x0;
  uStack_298 = 0;
  local_297 = 0;
  local_48 = false;
  local_44 = (storage_t<int>)0x0;
  local_40 = false;
  local_3c = (storage_t<unsigned_int>)0x0;
  local_38 = false;
  local_34 = (storage_t<tinyusdz::Interpolation>)0x0;
  local_50 = false;
  vStack_68.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_68.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_68.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_90 = (pointer)0x0;
  pSStack_88 = (pointer)0x0;
  local_a0 = 0;
  pSStack_98 = (pointer)0x0;
  local_7b8 = stage;
  local_c0._16_8_ = pAVar8;
  local_a8 = pAVar8;
  ::std::operator+(&local_7a8,"primvars:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)varname);
  local_800 = &gprim->props;
  cVar6 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&local_800->_M_t,(key_type *)&local_7a8);
  p_Var11 = &(gprim->props)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var11) goto LAB_004fce1c;
  local_7b0 = out_primvar;
  if (1 < *(uint *)((long)&cVar6._M_node[0x17]._M_parent + 4)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_770,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"GetGeomPrimvar",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_770,0xa67);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7f8,"{} is not Attribute(Maybe Relationship?).","");
    fmt::format<std::__cxx11::string>(local_4c8,(fmt *)&local_7f8,&local_7a8,&pAVar8->_name);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_770,local_4c8[0]._M_dataplus._M_p,
                        CONCAT71(local_4c8[0]._M_string_length._1_7_,
                                 (undefined1)local_4c8[0]._M_string_length));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) {
      operator_delete(local_4c8[0]._M_dataplus._M_p,
                      CONCAT71(local_4c8[0].field_2._M_allocated_capacity._1_7_,
                               local_4c8[0].field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4c8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) {
        operator_delete(local_4c8[0]._M_dataplus._M_p,
                        CONCAT71(local_4c8[0].field_2._M_allocated_capacity._1_7_,
                                 local_4c8[0].field_2._M_local_buf[0]) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
    ::std::ios_base::~ios_base(&iStack_700);
LAB_004fbd44:
    bVar2 = false;
    goto LAB_004fce1c;
  }
  pAVar1 = (Attribute *)(cVar6._M_node + 2);
  bVar2 = Attribute::is_connection(pAVar1);
  if (bVar2) {
    local_770._0_8_ = local_770 + 0x10;
    local_770._8_8_ = 0;
    local_770[0x10] = '\0';
    local_770._32_4_ = Varying;
    local_770[0x24] = false;
    local_770._40_8_ = local_770 + 0x38;
    local_770._48_8_ = 0;
    local_770[0x38] = '\0';
    local_770._88_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_770._72_8_ = (void *)0x0;
    local_770[0x60] = false;
    local_770._104_8_ = (pointer)0x0;
    iStack_700 = (ios_base)0x0;
    uStack_6ff = 0;
    uStack_6f8 = 0;
    uStack_6f7 = 0;
    AStack_6d0.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
    AStack_6d0.elementSize.has_value_ = false;
    AStack_6d0.elementSize.contained = (storage_t<unsigned_int>)0x0;
    AStack_6d0.hidden.has_value_ = false;
    AStack_6d0.hidden.contained = (storage_t<bool>)0x0;
    AStack_6d0.comment.has_value_ = false;
    AStack_6d0.weight.contained = (storage_t<double>)0x0;
    AStack_6d0.connectability.has_value_ = false;
    AStack_6d0.bindMaterialAs.contained._16_8_ = 0;
    AStack_6d0.bindMaterialAs.contained._24_8_ = 0;
    AStack_6d0.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.bindMaterialAs.contained._8_8_ = 0;
    AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header;
    AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    AStack_6d0.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.comment.contained._8_8_ = 0;
    AStack_6d0.comment.contained._16_8_ = 0;
    AStack_6d0.comment.contained._24_8_ = 0;
    AStack_6d0.comment.contained._32_8_ = 0;
    AStack_6d0.comment.contained._40_8_ = 0;
    AStack_6d0.customData.has_value_ = false;
    AStack_6d0.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.customData.contained._8_8_ = 0;
    AStack_6d0.customData.contained._16_8_ = 0;
    AStack_6d0.customData.contained._24_8_ = 0;
    AStack_6d0.customData.contained._32_8_ = 0;
    AStack_6d0.customData.contained._40_8_ = 0;
    AStack_6d0.weight.has_value_ = false;
    AStack_6d0.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.connectability.contained._8_8_ = 0;
    AStack_6d0.connectability.contained._16_8_ = 0;
    AStack_6d0.connectability.contained._24_8_ = 0;
    AStack_6d0.outputName.has_value_ = false;
    AStack_6d0.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.outputName.contained._8_8_ = 0;
    AStack_6d0.outputName.contained._16_8_ = 0;
    AStack_6d0.outputName.contained._24_8_ = 0;
    AStack_6d0.renderType.has_value_ = false;
    AStack_6d0.sdrMetadata.has_value_ = false;
    AStack_6d0.renderType.contained._16_8_ = 0;
    AStack_6d0.renderType.contained._24_8_ = 0;
    AStack_6d0.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.renderType.contained._8_8_ = 0;
    AStack_6d0.displayName.has_value_ = false;
    AStack_6d0.sdrMetadata.contained._32_8_ = 0;
    AStack_6d0.sdrMetadata.contained._40_8_ = 0;
    AStack_6d0.sdrMetadata.contained._16_8_ = 0;
    AStack_6d0.sdrMetadata.contained._24_8_ = 0;
    AStack_6d0.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.sdrMetadata.contained._8_8_ = 0;
    AStack_6d0.displayGroup.has_value_ = false;
    AStack_6d0.displayName.contained._16_8_ = 0;
    AStack_6d0.displayName.contained._24_8_ = 0;
    AStack_6d0.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.displayName.contained._8_8_ = 0;
    AStack_6d0.bindMaterialAs.has_value_ = false;
    AStack_6d0.displayGroup.contained._16_8_ = 0;
    AStack_6d0.displayGroup.contained._24_8_ = 0;
    AStack_6d0.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_6d0.displayGroup.contained._8_8_ = 0;
    local_6e8[0x10] = 0;
    stack0xfffffffffffff929 = 0;
    local_6e8._0_8_ = (pointer)0x0;
    local_6e8[8] = 0;
    local_6e8._9_7_ = 0;
    AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    AStack_6d0.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    AStack_6d0.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AStack_6d0.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pAVar8 = (Attribute *)local_770;
    AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = GetTerminalAttribute(local_7b8,pAVar1,(string *)&local_7a8,pAVar8,err);
    if (!bVar2) {
      AttrMetas::~AttrMetas(&AStack_6d0);
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_6e8);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)(local_770 + 0x68));
      if ((vtable_type *)local_770._88_8_ != (vtable_type *)0x0) {
        (**(_func_void_storage_union_ptr **)(local_770._88_8_ + 0x20))
                  ((storage_union *)(local_770 + 0x48));
        local_770._88_8_ = (vtable_type *)0x0;
      }
      if ((undefined1 *)local_770._40_8_ != local_770 + 0x38) {
        operator_delete((void *)local_770._40_8_,CONCAT71(local_770._57_7_,local_770[0x38]) + 1);
      }
      if ((undefined1 *)local_770._0_8_ != local_770 + 0x10) {
        operator_delete((void *)local_770._0_8_,CONCAT71(local_770._17_7_,local_770[0x10]) + 1);
      }
      goto LAB_004fbd44;
    }
    GeomPrimvar::set_value((GeomPrimvar *)local_350,(Attribute *)local_770);
    AttrMetas::~AttrMetas(&AStack_6d0);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_6e8);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)(local_770 + 0x68));
    if ((vtable_type *)local_770._88_8_ != (vtable_type *)0x0) {
      (**(_func_void_storage_union_ptr **)(local_770._88_8_ + 0x20))
                ((storage_union *)(local_770 + 0x48));
      local_770._88_8_ = (vtable_type *)0x0;
    }
    if ((undefined1 *)local_770._40_8_ != local_770 + 0x38) {
      operator_delete((void *)local_770._40_8_,CONCAT71(local_770._57_7_,local_770[0x38]) + 1);
    }
    if ((undefined1 *)local_770._0_8_ != local_770 + 0x10) {
      operator_delete((void *)local_770._0_8_,CONCAT71(local_770._17_7_,local_770[0x10]) + 1);
    }
  }
  else {
    GeomPrimvar::set_value((GeomPrimvar *)local_350,pAVar1);
  }
  ::std::__cxx11::string::_M_assign((string *)local_350);
  if (((char)cVar6._M_node[7]._M_color == _S_black) &&
     (local_34 = *(storage_t<tinyusdz::Interpolation> *)&cVar6._M_node[7].field_0x4,
     local_38 == false)) {
    local_38 = true;
  }
  if ((*(char *)&cVar6._M_node[7]._M_parent == '\x01') &&
     (local_3c = *(storage_t<unsigned_int> *)((long)&cVar6._M_node[7]._M_parent + 4),
     local_40 == false)) {
    local_40 = true;
  }
  bVar2 = AttrMetas::has_unauthoredValuesIndex((AttrMetas *)(cVar6._M_node + 7));
  if ((bVar2) &&
     (local_44 = (storage_t<int>)
                 AttrMetas::get_unauthoredValuesIndex((AttrMetas *)(cVar6._M_node + 7)),
     local_48 == false)) {
    local_48 = true;
  }
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7f8,local_7a8._M_dataplus._M_p,
             local_7a8._M_dataplus._M_p + local_7a8._M_string_length);
  ::std::__cxx11::string::append((char *)&local_7f8);
  cVar6 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&local_800->_M_t,&local_7f8);
  if (((_Rb_tree_header *)cVar6._M_node == p_Var11) ||
     (1 < *(uint *)((long)&cVar6._M_node[0x17]._M_parent + 4))) goto LAB_004fcbb3;
  uVar4 = Attribute::type_id((Attribute *)(local_350 + 0x28));
  if ((uVar4 >> 0x14 & 1) == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_770,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"GetGeomPrimvar",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_770,0xa76);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    local_848._0_8_ = (pointer)(local_848 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_848,
               "Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}"
               ,"");
    fmt::format<std::__cxx11::string>(local_4c8,(fmt *)local_848,&local_7a8,&pAVar8->_name);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_770,local_4c8[0]._M_dataplus._M_p,
                        CONCAT71(local_4c8[0]._M_string_length._1_7_,
                                 (undefined1)local_4c8[0]._M_string_length));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) {
      operator_delete(local_4c8[0]._M_dataplus._M_p,
                      CONCAT71(local_4c8[0].field_2._M_allocated_capacity._1_7_,
                               local_4c8[0].field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
      operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4c8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) {
LAB_004fbfcc:
        operator_delete(local_4c8[0]._M_dataplus._M_p,
                        CONCAT71(local_4c8[0].field_2._M_allocated_capacity._1_7_,
                                 local_4c8[0].field_2._M_local_buf[0]) + 1);
      }
    }
LAB_004fbfdc:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
    ::std::ios_base::~ios_base(&iStack_700);
LAB_004fce02:
    bVar2 = false;
  }
  else {
    pAVar1 = (Attribute *)(cVar6._M_node + 2);
    bVar2 = Attribute::is_connection(pAVar1);
    if (bVar2) {
      local_770._0_8_ = local_770 + 0x10;
      local_770._8_8_ = 0;
      local_770[0x10] = '\0';
      local_770._32_4_ = Varying;
      local_770[0x24] = false;
      local_770._40_8_ = local_770 + 0x38;
      local_770._48_8_ = 0;
      local_770[0x38] = '\0';
      local_770._88_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_770._72_8_ = (void *)0x0;
      local_770[0x60] = false;
      local_770._104_8_ = (pointer)0x0;
      iStack_700 = (ios_base)0x0;
      uStack_6ff = 0;
      uStack_6f8 = 0;
      uStack_6f7 = 0;
      AStack_6d0.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
      AStack_6d0.elementSize.has_value_ = false;
      AStack_6d0.elementSize.contained = (storage_t<unsigned_int>)0x0;
      AStack_6d0.hidden.has_value_ = false;
      AStack_6d0.hidden.contained = (storage_t<bool>)0x0;
      AStack_6d0.comment.has_value_ = false;
      AStack_6d0.weight.contained = (storage_t<double>)0x0;
      AStack_6d0.connectability.has_value_ = false;
      AStack_6d0.bindMaterialAs.contained._16_8_ = 0;
      AStack_6d0.bindMaterialAs.contained._24_8_ = 0;
      AStack_6d0.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.bindMaterialAs.contained._8_8_ = 0;
      AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header;
      AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      AStack_6d0.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.comment.contained._8_8_ = 0;
      AStack_6d0.comment.contained._16_8_ = 0;
      AStack_6d0.comment.contained._24_8_ = 0;
      AStack_6d0.comment.contained._32_8_ = 0;
      AStack_6d0.comment.contained._40_8_ = 0;
      AStack_6d0.customData.has_value_ = false;
      AStack_6d0.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.customData.contained._8_8_ = 0;
      AStack_6d0.customData.contained._16_8_ = 0;
      AStack_6d0.customData.contained._24_8_ = 0;
      AStack_6d0.customData.contained._32_8_ = 0;
      AStack_6d0.customData.contained._40_8_ = 0;
      AStack_6d0.weight.has_value_ = false;
      AStack_6d0.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.connectability.contained._8_8_ = 0;
      AStack_6d0.connectability.contained._16_8_ = 0;
      AStack_6d0.connectability.contained._24_8_ = 0;
      AStack_6d0.outputName.has_value_ = false;
      AStack_6d0.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.outputName.contained._8_8_ = 0;
      AStack_6d0.outputName.contained._16_8_ = 0;
      AStack_6d0.outputName.contained._24_8_ = 0;
      AStack_6d0.renderType.has_value_ = false;
      AStack_6d0.sdrMetadata.has_value_ = false;
      AStack_6d0.renderType.contained._16_8_ = 0;
      AStack_6d0.renderType.contained._24_8_ = 0;
      AStack_6d0.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.renderType.contained._8_8_ = 0;
      AStack_6d0.displayName.has_value_ = false;
      AStack_6d0.sdrMetadata.contained._32_8_ = 0;
      AStack_6d0.sdrMetadata.contained._40_8_ = 0;
      AStack_6d0.sdrMetadata.contained._16_8_ = 0;
      AStack_6d0.sdrMetadata.contained._24_8_ = 0;
      AStack_6d0.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.sdrMetadata.contained._8_8_ = 0;
      AStack_6d0.displayGroup.has_value_ = false;
      AStack_6d0.displayName.contained._16_8_ = 0;
      AStack_6d0.displayName.contained._24_8_ = 0;
      AStack_6d0.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.displayName.contained._8_8_ = 0;
      AStack_6d0.bindMaterialAs.has_value_ = false;
      AStack_6d0.displayGroup.contained._16_8_ = 0;
      AStack_6d0.displayGroup.contained._24_8_ = 0;
      AStack_6d0.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_6d0.displayGroup.contained._8_8_ = 0;
      local_6e8[0x10] = 0;
      stack0xfffffffffffff929 = 0;
      local_6e8._0_8_ = (pointer)0x0;
      local_6e8[8] = 0;
      local_6e8._9_7_ = 0;
      AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      AStack_6d0.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_6d0.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AStack_6d0.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pAVar8 = (Attribute *)local_770;
      AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           AStack_6d0.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar2 = GetTerminalAttribute(local_7b8,pAVar1,&local_7f8,pAVar8,err);
      if (bVar2) {
        if ((local_770[0x60] != false) ||
           (((((vtable_type *)local_770._88_8_ == (vtable_type *)0x0 ||
              (uVar4 = (**(_func_uint32_t **)local_770._88_8_)(), uVar4 != 0)) &&
             (((vtable_type *)local_770._88_8_ == (vtable_type *)0x0 ||
              (uVar4 = (**(_func_uint32_t **)local_770._88_8_)(), uVar4 != 1)))) ||
            ((pointer)CONCAT71(uStack_6ff,iStack_700) != (pointer)local_770._104_8_)))) {
          if ((pointer)CONCAT71(uStack_6ff,iStack_700) != (pointer)local_770._104_8_) {
            local_848[0x10] = '\0';
            local_848._17_7_ = 0;
            local_848[0x18] = false;
            local_848._0_8_ = (pointer)0x0;
            local_848[8] = 0;
            local_848._9_7_ = 0;
            bVar2 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                              ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                               local_848,(TimeSamples *)(local_770 + 0x68));
            if (bVar2) {
              ::std::
              vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
              ::operator=((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                           *)(local_c0 + 0x58),
                          (vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                           *)local_848);
              local_50 = (bool)local_848[0x18];
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"GetGeomPrimvar",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<(local_4c8,0xa8c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_7d8,
                         "Index Attribute seems not an timesamples with int[] type: {}","");
              fmt::format<std::__cxx11::string>
                        (&local_820,(fmt *)&local_7d8,(string *)&local_7f8,&pAVar8->_name);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,local_820._M_dataplus._M_p,
                                  local_820._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_820._M_dataplus._M_p != &local_820.field_2) {
                operator_delete(local_820._M_dataplus._M_p,
                                local_820.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                operator_delete(local_7d8._M_dataplus._M_p,
                                local_7d8.field_2._M_allocated_capacity + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_820._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_820._M_dataplus._M_p != &local_820.field_2) {
                  operator_delete(local_820._M_dataplus._M_p,
                                  local_820.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base(local_458);
            }
            ::std::
            vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
            ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                       *)local_848);
            if (!bVar2) goto LAB_004fcdf5;
          }
          if ((local_770[0x60] != false) ||
             ((((vtable_type *)local_770._88_8_ == (vtable_type *)0x0 ||
               (uVar4 = (**(_func_uint32_t **)local_770._88_8_)(), uVar4 != 0)) &&
              (((vtable_type *)local_770._88_8_ == (vtable_type *)0x0 ||
               (uVar4 = (**(_func_uint32_t **)local_770._88_8_)(), uVar4 != 1)))))) {
            local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            bVar2 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                              ((Attribute *)local_770,&local_788);
            if (bVar2) {
              ::std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_c0 + 0x40),&local_788);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"GetGeomPrimvar",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<(local_4c8,0xa99);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_820,"Index Attribute is not int[] type. Got {}","");
              Attribute::type_name_abi_cxx11_(&local_7d8,pAVar1);
              fmt::format<std::__cxx11::string>
                        ((string *)local_848,(fmt *)&local_820,(string *)&local_7d8,&pAVar8->_name);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_848._0_8_,
                                  CONCAT71(local_848._9_7_,local_848[8]));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
                operator_delete((void *)local_848._0_8_,
                                CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                operator_delete(local_7d8._M_dataplus._M_p,
                                local_7d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_820._M_dataplus._M_p != &local_820.field_2) {
                operator_delete(local_820._M_dataplus._M_p,
                                local_820.field_2._M_allocated_capacity + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)err,local_848._0_8_);
                if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
                  operator_delete((void *)local_848._0_8_,
                                  CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base(local_458);
            }
            if (local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_788.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (!bVar2) goto LAB_004fcdf5;
          }
          Attribute::~Attribute((Attribute *)local_770);
          goto LAB_004fcbb3;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4c8,"GetGeomPrimvar",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<(local_4c8,0xa83);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4c8,
                   "[Internal Error] Invalid Terminal Index Attribute. Terminal Index Attribute does not have `default` or timesamples value."
                   ,0x79);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_848._0_8_);
          if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
            operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
        ::std::ios_base::~ios_base(local_458);
      }
LAB_004fcdf5:
      Attribute::~Attribute((Attribute *)local_770);
      goto LAB_004fce02;
    }
    if (cVar6._M_node[5]._M_left == cVar6._M_node[5]._M_parent) {
      if (cVar6._M_node[4]._M_right == (_Base_ptr)0x0) {
        bVar2 = false;
      }
      else {
        iVar5 = (**(code **)cVar6._M_node[4]._M_right)();
        bVar2 = iVar5 == 4;
      }
      if ((bVar2) || ((cVar6._M_node[5]._M_color & _S_black) != _S_red)) goto LAB_004fcbb3;
    }
    if ((((char)cVar6._M_node[5]._M_color == _S_red) &&
        (((cVar6._M_node[4]._M_right != (_Base_ptr)0x0 &&
          (iVar5 = (**(code **)cVar6._M_node[4]._M_right)(), iVar5 == 0)) ||
         ((cVar6._M_node[4]._M_right != (_Base_ptr)0x0 &&
          (iVar5 = (**(code **)cVar6._M_node[4]._M_right)(), iVar5 == 1)))))) &&
       (cVar6._M_node[5]._M_left == cVar6._M_node[5]._M_parent)) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_770,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_770,"GetGeomPrimvar",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_770,0xaa6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_770,
                 "[Internal Error] Invalid Index Attribute. Index Attribute does not have `default` or timesamples value."
                 ,0x67);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4c8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) goto LAB_004fbfcc;
      }
      goto LAB_004fbfdc;
    }
    if (((char)cVar6._M_node[5]._M_color != _S_red) ||
       (((cVar6._M_node[4]._M_right == (_Base_ptr)0x0 ||
         (iVar5 = (**(code **)cVar6._M_node[4]._M_right)(), iVar5 != 0)) &&
        ((cVar6._M_node[4]._M_right == (_Base_ptr)0x0 ||
         (iVar5 = (**(code **)cVar6._M_node[4]._M_right)(), iVar5 != 1)))))) {
      local_7d8._M_dataplus._M_p = (pointer)0x0;
      local_7d8._M_string_length = 0;
      local_7d8.field_2._M_allocated_capacity = 0;
      cVar3 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                        (pAVar1,(vector<int,_std::allocator<int>_> *)&local_7d8);
      if ((bool)cVar3) {
        ::std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)(local_c0 + 0x40),
                   (vector<int,_std::allocator<int>_> *)&local_7d8);
      }
      else {
        local_800 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)CONCAT71(local_800._1_7_,cVar3);
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_770,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_770,"GetGeomPrimvar",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_770,0xab0);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        local_848._0_8_ = local_848 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_848,"Index Attribute is not int[] type. Got {}","");
        Attribute::type_name_abi_cxx11_((string *)&local_820,pAVar1);
        fmt::format<std::__cxx11::string>(local_4c8,(fmt *)local_848,&local_820,&pAVar8->_name);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_770,local_4c8[0]._M_dataplus._M_p,
                            CONCAT71(local_4c8[0]._M_string_length._1_7_,
                                     (undefined1)local_4c8[0]._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) {
          operator_delete(local_4c8[0]._M_dataplus._M_p,
                          CONCAT71(local_4c8[0].field_2._M_allocated_capacity._1_7_,
                                   local_4c8[0].field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_820._M_dataplus._M_p != &local_820.field_2) {
          operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
          operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4c8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8[0]._M_dataplus._M_p != &local_4c8[0].field_2) {
            operator_delete(local_4c8[0]._M_dataplus._M_p,
                            CONCAT71(local_4c8[0].field_2._M_allocated_capacity._1_7_,
                                     local_4c8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
        ::std::ios_base::~ios_base(&iStack_700);
        cVar3 = (char)local_800;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_7d8._M_dataplus._M_p,
                        local_7d8.field_2._M_allocated_capacity - (long)local_7d8._M_dataplus._M_p);
      }
      if (cVar3 == '\0') goto LAB_004fce02;
    }
    if (cVar6._M_node[5]._M_left != cVar6._M_node[5]._M_parent) {
      local_4c8[0].field_2._M_local_buf[0] = '\0';
      local_4c8[0].field_2._M_allocated_capacity._1_7_ = 0;
      local_4c8[0].field_2._M_local_buf[8] = '\0';
      local_4c8[0]._M_dataplus._M_p = (char *)0x0;
      local_4c8[0]._M_string_length._0_1_ = 0;
      local_4c8[0]._M_string_length._1_7_ = 0;
      bVar2 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                        ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_4c8,
                         (TimeSamples *)&cVar6._M_node[5]._M_parent);
      if (bVar2) {
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ::operator=((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                     *)(local_c0 + 0x58),
                    (vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                     *)local_4c8);
        local_50 = (bool)local_4c8[0].field_2._8_1_;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_770,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_770,"GetGeomPrimvar",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_770,0xabb);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_820,
                   "Index Attribute seems not an timesamples with int[] type: {}","");
        fmt::format<std::__cxx11::string>
                  ((string *)local_848,(fmt *)&local_820,(string *)&local_7f8,&pAVar8->_name);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_770,(char *)local_848._0_8_,
                            CONCAT71(local_848._9_7_,local_848[8]));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
          operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_820._M_dataplus._M_p != &local_820.field_2) {
          operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_848._0_8_);
          if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
            operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
        ::std::ios_base::~ios_base(&iStack_700);
      }
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                 *)local_4c8);
      if (!bVar2) goto LAB_004fce02;
    }
LAB_004fcbb3:
    GeomPrimvar::operator=(local_7b0,(GeomPrimvar *)local_350);
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
LAB_004fce1c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  GeomPrimvar::~GeomPrimvar((GeomPrimvar *)local_350);
  return bVar2;
}

Assistant:

bool GetGeomPrimvar(const Stage &stage, const GPrim *gprim,
                    const std::string &varname, GeomPrimvar *out_primvar,
                    std::string *err) {
  if (!out_primvar) {
    PUSH_ERROR_AND_RETURN("Output GeomPrimvar is nullptr.");
  }

  if (!gprim) {
    PUSH_ERROR_AND_RETURN("Input `gprim` arg is nullptr.");
  }

  GeomPrimvar primvar;

  constexpr auto kPrimvars = "primvars:";
  constexpr auto kIndices = ":indices";

  std::string primvar_name = kPrimvars + varname;

  const auto it = gprim->props.find(primvar_name);
  if (it == gprim->props.end()) {
    return false;
  }

  // The order of Attribute value evaluation:
  // - default or timesamples
  // - connection


  if (it->second.is_attribute()) {
    const Attribute &attr = it->second.get_attribute();

    if (attr.is_connection()) { // attribute only contains 'connection'
      // follow targetPath to get Attribute 
      Attribute terminal_attr;
      bool ret = tydra::GetTerminalAttribute(stage, attr, primvar_name,
                                             &terminal_attr, err);
      if (!ret) {
        return false;
      }

      primvar.set_value(terminal_attr);

    } else {
      // default, timeSamples
      primvar.set_value(attr);
    }

    primvar.set_name(varname);

    if (attr.metas().interpolation.has_value()) {
      primvar.set_interpolation(attr.metas().interpolation.value());
    }
    if (attr.metas().elementSize.has_value()) {
      primvar.set_elementSize(attr.metas().elementSize.value());
    }
    if (attr.metas().has_unauthoredValuesIndex()) {
      primvar.set_unauthoredValuesIndex(attr.metas().get_unauthoredValuesIndex());
    }
    // TODO: copy other attribute metas?

  } else {
    PUSH_ERROR_AND_RETURN(
        fmt::format("{} is not Attribute(Maybe Relationship?).", primvar_name));
  }

  // has indices?
  std::string index_name = primvar_name + kIndices;
  const auto indexIt = gprim->props.find(index_name);

  if (indexIt != gprim->props.end()) {
    if (indexIt->second.is_attribute()) {
      const Attribute &indexAttr = indexIt->second.get_attribute();

      if (!(primvar.get_attribute().type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("Indexed GeomPrimVar with scalar PrimVar Attribute is "
                        "not supported. PrimVar name: {}",
                        primvar_name));
      }

      if (indexAttr.is_connection()) { // attribute only contains 'connection'
        // follow targetPath to get Attribute 
        Attribute terminal_indexAttr;
        bool ret = tydra::GetTerminalAttribute(stage, indexAttr, index_name,
                                               &terminal_indexAttr, err);
        if (!ret) {
          return false;
        }

        if (!terminal_indexAttr.has_value() && !terminal_indexAttr.has_timesamples()) {
          PUSH_ERROR_AND_RETURN("[Internal Error] Invalid Terminal Index Attribute. Terminal Index Attribute does not have `default` or timesamples value.");
        }

        if (terminal_indexAttr.has_timesamples()) {
          const auto &ts = terminal_indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            PUSH_ERROR_AND_RETURN(fmt::format(
                "Index Attribute seems not an timesamples with int[] type: {}",
                index_name));
          }
        
          primvar.set_timesampled_indices(tss);
        }

        if (terminal_indexAttr.has_value()) {

          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!terminal_indexAttr.get_value(&indices)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }

          primvar.set_default_indices(indices);

        }
      
      } else if (indexAttr.is_blocked()) {
        // Value blocked. e.g. `float2[] primvars:st:indices = None`
        // We can simply skip reading indices.
      } else {

        if (!indexAttr.has_value() && !indexAttr.has_timesamples()) {
          PUSH_ERROR_AND_RETURN("[Internal Error] Invalid Index Attribute. Index Attribute does not have `default` or timesamples value.");
        }

        if (indexAttr.has_value()) {
          // Check if int[] type.
          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!indexAttr.get_value(&indices)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }


          primvar.set_default_indices(indices);
        }

        if (indexAttr.has_timesamples()) {
          const auto &ts = indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Index Attribute seems not an timesamples with int[] type: {}", index_name));
          }
        
          primvar.set_timesampled_indices(tss);
        }

      }
    } else {
      // indices are optional, so ok to skip it.
    }
  }

  (*out_primvar) = primvar;

  return true;
}